

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::mul(Matrix *this,double coef)

{
  pointer pvVar1;
  double *pdVar2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  vector<double,_std::allocator<double>_> *vec;
  pointer pvVar3;
  double *val;
  double *pdVar4;
  
  __range1 = &this->m_vals;
  pvVar1 = (this->m_vals).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar3 = (this->m_vals).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pvVar3 != pvVar1; pvVar3 = pvVar3 + 1) {
    pdVar2 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar4 = (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
      *pdVar4 = *pdVar4 * coef;
    }
  }
  return (Matrix *)__range1;
}

Assistant:

Matrix& Matrix::mul(double coef){
    for(auto& vec: m_vals){
        for(auto& val: vec){
            val*=coef;
        }
    }

    return *this;
}